

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetDelayAA(void *kinmem,long delay)

{
  long in_RSI;
  KINMem in_RDI;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x97,"KINSetDelayAA",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (in_RSI < 0) {
    KINProcessError(in_RDI,-2,0xa0,"KINSetDelayAA",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                    ,"delay < 0 illegal");
    local_4 = -2;
  }
  else {
    in_RDI->kin_delay_aa = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINSetDelayAA(void* kinmem, long int delay)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  /* check for illegal input value */
  if (delay < 0)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "delay < 0 illegal");
    return (KIN_ILL_INPUT);
  }

  kin_mem->kin_delay_aa = delay;

  return (KIN_SUCCESS);
}